

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O3

laszip_I32
laszip_open_reader_stream(laszip_POINTER pointer,istream *stream,laszip_BOOL *is_compressed)

{
  I32 IVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  
  if (pointer != (laszip_POINTER)0x0) {
    if (is_compressed == (laszip_BOOL *)0x0) {
      builtin_strncpy((char *)((long)pointer + 0x264),"ressed\' ",8);
      builtin_strncpy((char *)((long)pointer + 0x26c),"is zero",8);
      builtin_strncpy((char *)((long)pointer + 600),"ter \'is_",8);
      builtin_strncpy((char *)((long)pointer + 0x260),"compress",8);
      builtin_strncpy((char *)((long)pointer + 0x248),"laszip_B",8);
      builtin_strncpy((char *)((long)pointer + 0x250),"OOL poin",8);
    }
    else {
      if (*(long *)((long)pointer + 0x238) == 0) {
        if (*(long *)((long)pointer + 0x228) == 0) {
          puVar2 = (undefined8 *)operator_new(0x30);
          puVar2[1] = 0;
          *(undefined4 *)(puVar2 + 2) = 0;
          puVar2[3] = stream;
          *(undefined1 *)(puVar2 + 4) = 1;
          *puVar2 = &PTR_getByte_0015da68;
          *(undefined8 *)((long)puVar2 + 0x21) = 0;
          *(undefined8 **)((long)pointer + 0x220) = puVar2;
          IVar1 = laszip_read_header((laszip_dll_struct *)pointer,is_compressed);
          return IVar1;
        }
        uVar3._0_1_ = 'r';
        uVar3._1_1_ = 'e';
        uVar3._2_1_ = 'a';
        uVar3._3_1_ = 'd';
      }
      else {
        uVar3._0_1_ = 'w';
        uVar3._1_1_ = 'r';
        uVar3._2_1_ = 'i';
        uVar3._3_1_ = 't';
      }
      *(undefined4 *)((long)pointer + 0x248) = uVar3;
      builtin_strncpy((char *)((long)pointer + 0x24c),"er i",4);
      builtin_strncpy((char *)((long)pointer + 0x250),"s al",4);
      builtin_strncpy((char *)((long)pointer + 0x254),"read",4);
      *(undefined8 *)((long)pointer + 599) = 0x6e65706f207964;
    }
  }
  return 1;
}

Assistant:

LASZIP_API laszip_I32
laszip_open_reader_stream(
    laszip_POINTER                     pointer
    , std::istream&                    stream
    , laszip_BOOL*                     is_compressed
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    if (is_compressed == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "laszip_BOOL pointer 'is_compressed' is zero");
      return 1;
    }

    if (laszip_dll->writer)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writer is already open");
      return 1;
    }

    if (laszip_dll->reader)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "reader is already open");
      return 1;
    }

    // open the file

    if (IS_LITTLE_ENDIAN())
      laszip_dll->streamin = new ByteStreamInIstreamLE(stream);
    else
      laszip_dll->streamin = new ByteStreamInIstreamBE(stream);

    if (laszip_dll->streamin == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "could not alloc ByteStreamInIstream");
      return 1;
    }

    return laszip_read_header(laszip_dll, is_compressed);
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_open_reader");
    return 1;
  }
}